

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O1

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,binary_expr *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  iVar1 = (*((other->lhs_)._M_ptr)->_vptr_rt_expression_interface[2])();
  (this->lhs_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((other->op_)._M_ptr)->_vptr_op_interface[2])();
  (this->op_)._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)CONCAT44(extraout_var_00,iVar1)
  ;
  iVar1 = (*((other->rhs_)._M_ptr)->_vptr_rt_expression_interface[2])();
  (this->rhs_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar1);
  return;
}

Assistant:

rt_binary_expr(binary_expr const & other) : lhs_(other.lhs_->clone()),
                                               op_(other.op_->clone()),
                                               rhs_(other.rhs_->clone()) {}